

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double betaln(double *a0,double *b0)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *b0_local;
  double *a0_local;
  
  betaln::a = fifdmin1(*a0,*b0);
  betaln::b = fifdmax1(*a0,*b0);
  if (betaln::a < 8.0) {
    if (betaln::a < 1.0) {
      if (betaln::b < 8.0) {
        betaln::T1 = betaln::a + betaln::b;
        dVar5 = gamln(&betaln::a);
        dVar3 = gamln(&betaln::b);
        dVar4 = gamln(&betaln::T1);
        a0_local = (double *)(dVar5 + (dVar3 - dVar4));
      }
      else {
        dVar5 = gamln(&betaln::a);
        dVar3 = algdiv(&betaln::a,&betaln::b);
        a0_local = (double *)(dVar5 + dVar3);
      }
    }
    else {
      if (betaln::a <= 2.0) {
        if (betaln::b <= 2.0) {
          dVar5 = gamln(&betaln::a);
          dVar3 = gamln(&betaln::b);
          dVar4 = gsumln(&betaln::a,&betaln::b);
          betaln::betaln = (dVar5 + dVar3) - dVar4;
          return betaln::betaln;
        }
        betaln::w = 0.0;
        if (8.0 <= betaln::b) {
          dVar5 = gamln(&betaln::a);
          dVar3 = algdiv(&betaln::a,&betaln::b);
          betaln::betaln = dVar5 + dVar3;
          return dVar5 + dVar3;
        }
      }
      else {
        if (1000.0 < betaln::b) {
          betaln::n = (int)(betaln::a - 1.0);
          betaln::w = 1.0;
          for (betaln::i = 1; betaln::i <= betaln::n; betaln::i = betaln::i + 1) {
            betaln::a = betaln::a - 1.0;
            betaln::w = (betaln::a / (betaln::a / betaln::b + 1.0)) * betaln::w;
          }
          dVar5 = log(betaln::w);
          dVar3 = (double)betaln::n;
          dVar4 = log(betaln::b);
          dVar1 = gamln(&betaln::a);
          dVar2 = algdiv(&betaln::a,&betaln::b);
          betaln::betaln = -dVar3 * dVar4 + dVar5 + dVar1 + dVar2;
          return betaln::betaln;
        }
        betaln::n = (int)(betaln::a - 1.0);
        betaln::w = 1.0;
        for (betaln::i = 1; betaln::i <= betaln::n; betaln::i = betaln::i + 1) {
          betaln::a = betaln::a - 1.0;
          betaln::h = betaln::a / betaln::b;
          betaln::w = (betaln::h / (betaln::h + 1.0)) * betaln::w;
        }
        dVar5 = log(betaln::w);
        betaln::w = dVar5;
        if (8.0 <= betaln::b) {
          dVar3 = gamln(&betaln::a);
          dVar4 = algdiv(&betaln::a,&betaln::b);
          betaln::betaln = dVar5 + dVar3 + dVar4;
          return betaln::betaln;
        }
      }
      dVar5 = betaln::w;
      betaln::n = (int)(betaln::b - 1.0);
      betaln::z = 1.0;
      for (betaln::i = 1; betaln::i <= betaln::n; betaln::i = betaln::i + 1) {
        betaln::b = betaln::b - 1.0;
        betaln::z = (betaln::b / (betaln::a + betaln::b)) * betaln::z;
      }
      dVar3 = log(betaln::z);
      dVar4 = gamln(&betaln::a);
      dVar1 = gamln(&betaln::b);
      dVar2 = gsumln(&betaln::a,&betaln::b);
      a0_local = (double *)(dVar5 + dVar3 + dVar4 + (dVar1 - dVar2));
    }
  }
  else {
    betaln::w = bcorr(&betaln::a,&betaln::b);
    betaln::h = betaln::a / betaln::b;
    betaln::c = betaln::h / (betaln::h + 1.0);
    dVar3 = betaln::a - 0.5;
    dVar4 = log(betaln::c);
    dVar5 = betaln::b;
    betaln::u = -(dVar3 * dVar4);
    dVar3 = alnrel(&betaln::h);
    betaln::v = dVar5 * dVar3;
    if (betaln::v < betaln::u) {
      dVar5 = log(betaln::b);
      a0_local = (double *)(((dVar5 * -0.5 + betaln::e + betaln::w) - betaln::v) - betaln::u);
    }
    else {
      dVar5 = log(betaln::b);
      a0_local = (double *)(((dVar5 * -0.5 + betaln::e + betaln::w) - betaln::u) - betaln::v);
    }
  }
  betaln::betaln = (double)a0_local;
  return (double)a0_local;
}

Assistant:

double betaln(double *a0,double *b0)
/*
-----------------------------------------------------------------------
     EVALUATION OF THE LOGARITHM OF THE BETA FUNCTION
-----------------------------------------------------------------------
     E = 0.5*LN(2*PI)
--------------------------
*/
{
static double e = .918938533204673e0;
static double betaln,a,b,c,h,u,v,w,z;
static int i,n;
static double T1;
/*
     ..
     .. Executable Statements ..
*/
    a = fifdmin1(*a0,*b0);
    b = fifdmax1(*a0,*b0);
    if(a >= 8.0e0) goto S100;
    if(a >= 1.0e0) goto S20;
/*
-----------------------------------------------------------------------
                   PROCEDURE WHEN A .LT. 1
-----------------------------------------------------------------------
*/
    if(b >= 8.0e0) goto S10;
    T1 = a+b;
    betaln = gamln(&a)+(gamln(&b)-gamln(&T1));
    return betaln;
S10:
    betaln = gamln(&a)+algdiv(&a,&b);
    return betaln;
S20:
/*
-----------------------------------------------------------------------
                PROCEDURE WHEN 1 .LE. A .LT. 8
-----------------------------------------------------------------------
*/
    if(a > 2.0e0) goto S40;
    if(b > 2.0e0) goto S30;
    betaln = gamln(&a)+gamln(&b)-gsumln(&a,&b);
    return betaln;
S30:
    w = 0.0e0;
    if(b < 8.0e0) goto S60;
    betaln = gamln(&a)+algdiv(&a,&b);
    return betaln;
S40:
/*
                REDUCTION OF A WHEN B .LE. 1000
*/
    if(b > 1000.0e0) goto S80;
    n = a-1.0e0;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        a -= 1.0e0;
        h = a/b;
        w *= (h/(1.0e0+h));
    }
    w = log(w);
    if(b < 8.0e0) goto S60;
    betaln = w+gamln(&a)+algdiv(&a,&b);
    return betaln;
S60:
/*
                 REDUCTION OF B WHEN B .LT. 8
*/
    n = b-1.0e0;
    z = 1.0e0;
    for(i=1; i<=n; i++) {
        b -= 1.0e0;
        z *= (b/(a+b));
    }
    betaln = w+log(z)+(gamln(&a)+(gamln(&b)-gsumln(&a,&b)));
    return betaln;
S80:
/*
                REDUCTION OF A WHEN B .GT. 1000
*/
    n = a-1.0e0;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        a -= 1.0e0;
        w *= (a/(1.0e0+a/b));
    }
    betaln = log(w)-(double)n*log(b)+(gamln(&a)+algdiv(&a,&b));
    return betaln;
S100:
/*
-----------------------------------------------------------------------
                   PROCEDURE WHEN A .GE. 8
-----------------------------------------------------------------------
*/
    w = bcorr(&a,&b);
    h = a/b;
    c = h/(1.0e0+h);
    u = -((a-0.5e0)*log(c));
    v = b*alnrel(&h);
    if(u <= v) goto S110;
    betaln = -(0.5e0*log(b))+e+w-v-u;
    return betaln;
S110:
    betaln = -(0.5e0*log(b))+e+w-u-v;
    return betaln;
}